

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patas_scan.hpp
# Opt level: O0

void __thiscall
duckdb::PatasScanState<double>::PatasScanState(PatasScanState<double> *this,ColumnSegment *segment)

{
  uint uVar1;
  _func_int **pp_Var2;
  data_ptr_t pdVar3;
  idx_t iVar4;
  ColumnSegment *in_RSI;
  SegmentScanState *in_RDI;
  uint metadata_offset;
  BufferManager *buffer_manager;
  BufferHandle *this_00;
  __atomic_base<unsigned_long> *in_stack_ffffffffffffff98;
  BufferHandle *in_stack_ffffffffffffffa0;
  BufferHandle local_40;
  BufferManager *local_28;
  ColumnSegment *local_10;
  
  local_10 = in_RSI;
  SegmentScanState::SegmentScanState(in_RDI);
  in_RDI->_vptr_SegmentScanState = (_func_int **)&PTR__PatasScanState_03510508;
  BufferHandle::BufferHandle(in_stack_ffffffffffffffa0);
  in_RDI[6]._vptr_SegmentScanState = (_func_int **)0x0;
  PatasGroupState<unsigned_long>::PatasGroupState((PatasGroupState<unsigned_long> *)0xaa90a6);
  in_RDI[0x58a]._vptr_SegmentScanState = (_func_int **)local_10;
  pp_Var2 = (_func_int **)
            ::std::__atomic_base::operator_cast_to_unsigned_long(in_stack_ffffffffffffff98);
  in_RDI[0x58b]._vptr_SegmentScanState = pp_Var2;
  local_28 = BufferManager::GetBufferManager((DatabaseInstance *)0xaa90e4);
  (*local_28->_vptr_BufferManager[7])(&local_40,local_28,&local_10->block);
  this_00 = (BufferHandle *)(in_RDI + 1);
  BufferHandle::operator=(this_00,&local_40);
  BufferHandle::~BufferHandle(this_00);
  pdVar3 = BufferHandle::Ptr((BufferHandle *)0xaa9145);
  iVar4 = ColumnSegment::GetBlockOffset(local_10);
  in_RDI[5]._vptr_SegmentScanState = (_func_int **)(pdVar3 + iVar4);
  uVar1 = Load<unsigned_int>((const_data_ptr_t)in_RDI[5]._vptr_SegmentScanState);
  in_RDI[4]._vptr_SegmentScanState =
       (_func_int **)((long)in_RDI[5]._vptr_SegmentScanState + (ulong)uVar1);
  return;
}

Assistant:

explicit PatasScanState(ColumnSegment &segment) : segment(segment), count(segment.count) {
		auto &buffer_manager = BufferManager::GetBufferManager(segment.db);

		handle = buffer_manager.Pin(segment.block);
		// ScanStates never exceed the boundaries of a Segment,
		// but are not guaranteed to start at the beginning of the Block
		segment_data = handle.Ptr() + segment.GetBlockOffset();
		auto metadata_offset = Load<uint32_t>(segment_data);
		metadata_ptr = segment_data + metadata_offset;
	}